

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O0

string * duckdb::StandardStringCast<unsigned_short>(unsigned_short input)

{
  string *in_RDI;
  anon_union_16_2_67f50693_for_value aVar1;
  Vector v;
  Vector *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  uint16_t input_00;
  LogicalType *in_stack_ffffffffffffff50;
  idx_t in_stack_ffffffffffffff60;
  LogicalType *in_stack_ffffffffffffff68;
  Vector *in_stack_ffffffffffffff70;
  
  input_00 = (uint16_t)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  LogicalType::LogicalType
            (in_stack_ffffffffffffff50,(LogicalTypeId)((ulong)&stack0xffffffffffffff70 >> 0x38));
  Vector::Vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  LogicalType::~LogicalType((LogicalType *)0x2b1d75b);
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringCast::Operation<unsigned_short>(input_00,in_stack_ffffffffffffff28);
  string_t::GetString((string_t *)in_stack_ffffffffffffff68);
  Vector::~Vector(aVar1._0_8_);
  return in_RDI;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}